

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O1

spv_result_t spvtools::val::ImagePass(ValidationState_t *_,Instruction *inst)

{
  size_t *psVar1;
  uint16_t uVar2;
  spv_target_env sVar3;
  pointer puVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  spv_result_t sVar8;
  Op OVar9;
  spv_result_t sVar10;
  StorageClass SVar11;
  uint32_t uVar12;
  uint id;
  uint32_t uVar13;
  Op OVar14;
  int32_t iVar15;
  Function *pFVar16;
  _Node *p_Var17;
  _Node *p_Var18;
  Instruction *pIVar19;
  Instruction *this;
  undefined7 extraout_var;
  undefined7 uVar22;
  undefined7 extraout_var_00;
  long *plVar20;
  DiagnosticStream *pDVar21;
  uint uVar23;
  size_type *psVar24;
  Decoration decor;
  long lVar25;
  spv_result_t sVar26;
  char *pcVar27;
  _Any_data *val;
  code *pcVar28;
  undefined8 uVar29;
  pointer ppIVar30;
  ushort uVar31;
  bool bVar32;
  ImageTypeInfo info;
  ImageTypeInfo sampled_info;
  uint32_t actual_result_type;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> consumers;
  _Any_data local_2e8;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  _Any_data local_2c8;
  undefined8 local_2b8;
  undefined8 local_2b0;
  ulong local_2a0;
  _Alloc_hider local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_288;
  Function *local_278;
  char *local_270;
  undefined1 local_268 [464];
  spv_result_t local_98;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> local_90;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  val = &local_2e8;
  uVar31 = (inst->inst_).opcode;
  OVar9 = CONCAT22(0,uVar31);
  bVar6 = anon_unknown_0::IsImplicitLod(OVar9);
  if (bVar6) {
    pFVar16 = ValidationState_t::function(_,inst->function_->id_);
    local_58._8_8_ = 0;
    local_58._2_6_ = 0;
    local_58._0_2_ = uVar31;
    pcStack_40 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2328:44)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2328:44)>
               ::_M_manager;
    p_Var17 = std::__cxx11::
              list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                          *)&pFVar16->execution_model_limitations_,
                         (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_58);
    std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
    psVar1 = &(pFVar16->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    pFVar16 = ValidationState_t::function(_,inst->function_->id_);
    local_78._8_8_ = 0;
    local_78._4_4_ = 0;
    local_78._0_4_ = OVar9;
    pcStack_60 = std::
                 _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2346:30)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2346:30)>
               ::_M_manager;
    p_Var18 = std::__cxx11::
              list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
              ::
              _M_create_node<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
                          *)&pFVar16->limitations_,
                         (function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_78);
    std::__detail::_List_node_base::_M_hook(&p_Var18->super__List_node_base);
    psVar1 = &(pFVar16->limitations_).
              super__List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  sVar8 = SPV_SUCCESS;
  sVar10 = SPV_SUCCESS;
  sVar26 = SPV_SUCCESS;
  if (OVar9 != OpBuildNDRange && 0x12f < uVar31) {
    sVar10 = sVar26;
    switch(OVar9) {
    case OpImageSparseSampleImplicitLod:
    case OpImageSparseSampleExplicitLod:
      goto switchD_006481c4_caseD_57;
    case OpImageSparseSampleDrefImplicitLod:
    case OpImageSparseSampleDrefExplicitLod:
      goto switchD_006481c4_caseD_59;
    case OpImageSparseSampleProjImplicitLod:
    case OpImageSparseSampleProjExplicitLod:
    case OpImageSparseSampleProjDrefImplicitLod:
    case OpImageSparseSampleProjDrefExplicitLod:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,
                 "Instruction reserved for future use, use of this instruction ",0x3d);
      pcVar27 = "is invalid";
      lVar25 = 10;
      goto LAB_00649b43;
    case OpImageSparseFetch:
      goto switchD_006481c4_caseD_5f;
    case OpImageSparseGather:
    case OpImageSparseDrefGather:
      goto switchD_006481c4_caseD_60;
    case OpImageSparseTexelsResident:
      goto switchD_00648264_caseD_13c;
    case OpNoLine:
    case OpAtomicFlagTestAndSet:
    case OpAtomicFlagClear:
      goto switchD_006481c4_caseD_3d;
    case OpImageSparseRead:
      goto switchD_006481c4_caseD_62;
    default:
      if (0x17 < OVar9 - OpImageSampleWeightedQCOM) {
        return SPV_SUCCESS;
      }
      if ((0xf0000fU >> (OVar9 - OpImageSampleWeightedQCOM & 0x1f) & 1) == 0) {
        return SPV_SUCCESS;
      }
      uVar31 = (inst->inst_).opcode;
      uVar23 = uVar31 - 0x1182;
      if (uVar23 < 0x16) {
        if ((3U >> (uVar23 & 0x1f) & 1) == 0) {
          if ((0xc0000U >> (uVar23 & 0x1f) & 1) != 0) {
            iVar7 = Instruction::GetOperandAs<int>(inst,2);
            sVar8 = anon_unknown_0::ValidateImageProcessing2QCOMWindowDecoration(_,iVar7);
            if (sVar8 == SPV_SUCCESS) {
              iVar7 = Instruction::GetOperandAs<int>(inst,4);
              sVar8 = anon_unknown_0::ValidateImageProcessing2QCOMWindowDecoration(_,iVar7);
              return sVar8;
            }
            return sVar8;
          }
          if ((0x300000U >> (uVar23 & 0x1f) & 1) == 0) goto LAB_00648b53;
        }
        iVar7 = Instruction::GetOperandAs<int>(inst,2);
        sVar8 = anon_unknown_0::ValidateImageProcessingQCOMDecoration(_,iVar7,BlockMatchTextureQCOM)
        ;
        if (sVar8 != SPV_SUCCESS) {
          return sVar8;
        }
        iVar7 = Instruction::GetOperandAs<int>(inst,4);
        decor = BlockMatchTextureQCOM;
      }
      else {
LAB_00648b53:
        if (uVar31 != 0x1180) {
          return SPV_SUCCESS;
        }
        iVar7 = Instruction::GetOperandAs<int>(inst,4);
        decor = DecorationWeightTextureQCOM;
      }
      sVar10 = anon_unknown_0::ValidateImageProcessingQCOMDecoration(_,iVar7,decor);
      goto switchD_006481c4_caseD_3d;
    }
  }
  switch(OVar9) {
  case OpImageTexelPointer:
    pIVar19 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar2 = (pIVar19->inst_).opcode;
    if ((uVar2 == 0x20) || (uVar2 == 0x1141)) {
      SVar11 = Instruction::GetOperandAs<spv::StorageClass>(pIVar19,1);
      if (SVar11 == Image) {
        if ((pIVar19->inst_).opcode == 0x20) {
          uVar23 = Instruction::GetOperandAs<unsigned_int>(pIVar19,2);
          OVar9 = ValidationState_t::GetIdOpcode(_,uVar23);
          bVar6 = true;
          if (((1 < OVar9 - OpTypeInt) && (sVar10 = sVar26, OVar9 != OpTypeVoid)) &&
             ((OVar9 != OpTypeVector ||
              ((bVar32 = EnumSet<spv::Capability>::contains
                                   (&_->module_capabilities_,AtomicFloat16VectorNV), !bVar32 ||
               (bVar32 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar23), !bVar32)))))) {
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,
                       "Expected Result Type to be a pointer whose Type operand must be a scalar numerical type or OpTypeVoid"
                       ,0x65);
            sVar10 = local_98;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
            bVar6 = false;
          }
          if (!bVar6) {
            return sVar10;
          }
        }
        else {
          uVar23 = 0;
        }
        uVar12 = ValidationState_t::GetOperandTypeId(_,inst,2);
        this = ValidationState_t::FindDef(_,uVar12);
        if ((this == (Instruction *)0x0) || ((this->inst_).opcode != 0x20)) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = "Expected Image to be OpTypePointer";
          lVar25 = 0x22;
        }
        else {
          id = Instruction::GetOperandAs<unsigned_int>(this,2);
          OVar9 = ValidationState_t::GetIdOpcode(_,id);
          if (OVar9 == OpTypeImage) {
            local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
            local_2e8._8_8_ = 0;
            uStack_2d8 = (code *)0x0;
            local_2d0 = (code *)0x7fffffff7fffffff;
            bVar6 = anon_unknown_0::GetImageTypeInfo(_,id,(ImageTypeInfo *)&local_2e8);
            if (!bVar6) goto LAB_00649b1c;
            if (((pIVar19->inst_).opcode == 0x20) && (local_2e8._0_4_ != uVar23)) {
              bVar6 = EnumSet<spv::Capability>::contains
                                (&_->module_capabilities_,AtomicFloat16VectorNV);
              if ((bVar6) && (bVar6 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar23), bVar6))
              {
                OVar9 = ValidationState_t::GetIdOpcode(_,local_2e8._0_4_);
                if ((OVar9 == OpTypeFloat) &&
                   (((uVar12 = ValidationState_t::GetDimension(_,uVar23), uVar12 == 2 &&
                     ((int)local_2d0 == 7)) ||
                    ((uVar12 = ValidationState_t::GetDimension(_,uVar23), uVar12 == 4 &&
                     ((int)local_2d0 == 2)))))) goto LAB_00649adb;
              }
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = 
              "Expected Image \'Sampled Type\' to be the same as the Type pointed to by Result Type"
              ;
              lVar25 = 0x52;
              break;
            }
LAB_00649adb:
            if (local_2e8._4_4_ == 0x104d) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Image Dim TileImageDataEXT cannot be used with OpImageTexelPointer";
              goto LAB_0064993d;
            }
            if (local_2e8._4_4_ == 6) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Image Dim SubpassData cannot be used with OpImageTexelPointer";
              lVar25 = 0x3d;
              break;
            }
            uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
            if ((uVar12 == 0) ||
               (bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12), !bVar6)) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Expected Coordinate to be integer scalar or vector";
              goto LAB_0064b6a0;
            }
            if (local_2e8._12_4_ == 1) {
              if (local_2e8._4_4_ == 0) {
                uVar13 = 2;
              }
              else {
                if ((local_2e8._4_4_ != 3) && (local_2e8._4_4_ != 1)) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar27 = 
                  "Expected Image \'Dim\' must be one of 1D, 2D, or Cube when Arrayed is 1";
                  lVar25 = 0x45;
                  break;
                }
                uVar13 = 3;
              }
            }
            else {
              uVar13 = 0;
              if (local_2e8._12_4_ == 0) {
                uVar13 = anon_unknown_0::GetPlaneCoordSize((ImageTypeInfo *)&local_2e8);
              }
            }
            uVar12 = ValidationState_t::GetDimension(_,uVar12);
            if (uVar13 == uVar12) {
              uVar12 = ValidationState_t::GetOperandTypeId(_,inst,4);
              if ((uVar12 != 0) && (bVar6 = ValidationState_t::IsIntScalarType(_,uVar12), bVar6)) {
                if ((uint)uStack_2d8 == 0) {
                  local_2c8._M_unused._M_object = (_func_void *)0x0;
                  uVar23 = Instruction::GetOperandAs<unsigned_int>(inst,4);
                  bVar6 = ValidationState_t::EvalConstantValUint64
                                    (_,uVar23,(uint64_t *)local_2c8._M_pod_data);
                  if ((_func_void *)local_2c8._M_unused._0_8_ != (_func_void *)0x0 || !bVar6) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_268,
                               "Expected Sample for Image with MS 0 to be a valid <id> for the value 0"
                               ,0x46);
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
                    return local_98;
                  }
                }
                bVar6 = spvIsVulkanEnv(_->context_->target_env);
                if (!bVar6) {
                  return SPV_SUCCESS;
                }
                if (((ulong)local_2d0 & 0xffffffff) < 0x2a) {
                  if ((0x30201000008U >> ((ulong)local_2d0 & 0x3f) & 1) != 0) {
                    return SPV_SUCCESS;
                  }
                  if (((0x84UL >> ((ulong)local_2d0 & 0x3f) & 1) != 0) &&
                     (bVar6 = EnumSet<spv::Capability>::contains
                                        (&_->module_capabilities_,AtomicFloat16VectorNV), bVar6)) {
                    return SPV_SUCCESS;
                  }
                }
                ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1232,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
                pcVar27 = 
                "Expected the Image Format in Image to be R64i, R64ui, R32f, R32i, or R32ui for Vulkan environment"
                ;
                lVar25 = 0x61;
                goto LAB_006494a5;
              }
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Expected Sample to be integer scalar";
              goto LAB_006496a1;
            }
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,"Expected Coordinate to have ",0x1c);
            std::ostream::_M_insert<unsigned_long>((ulong)local_268);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268," components, but given ",0x17);
            goto LAB_0064af35;
          }
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = "Expected Image to be OpTypePointer with Type OpTypeImage";
LAB_0064843b:
          lVar25 = 0x38;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Result Type to be a pointer whose Storage Class operand is Image";
        lVar25 = 0x49;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Result Type to be a pointer";
LAB_006496a1:
      lVar25 = 0x24;
    }
    break;
  case OpLoad:
  case OpStore:
  case OpCopyMemory:
  case OpCopyMemorySized:
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpArrayLength:
  case OpGenericPtrMemSemantics:
  case OpInBoundsPtrAccessChain:
  case OpDecorate:
  case OpMemberDecorate:
  case OpDecorationGroup:
  case OpGroupDecorate:
  case OpGroupMemberDecorate:
  case OpMemberDecorate|OpSourceExtension:
  case OpVectorExtractDynamic:
  case OpVectorInsertDynamic:
  case OpVectorShuffle:
  case OpCompositeConstruct:
  case OpCompositeExtract:
  case OpCompositeInsert:
  case OpCopyObject:
  case OpTranspose:
  case OpTranspose|OpUndef:
    goto switchD_006481c4_caseD_3d;
  case OpSampledImage:
    pIVar19 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar19->inst_).opcode == 0x1b) {
      uVar12 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar9 = ValidationState_t::GetIdOpcode(_,uVar12);
      if (OVar9 != OpTypeImage) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Image to be of type OpTypeImage.";
LAB_00649734:
        lVar25 = 0x29;
        break;
      }
      local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
      local_2e8._8_8_ = 0;
      uStack_2d8 = (code *)0x0;
      local_2d0 = (code *)0x7fffffff7fffffff;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar12,(ImageTypeInfo *)&local_2e8);
      if (!bVar6) goto LAB_00649b1c;
      uVar23 = Instruction::GetOperandAs<unsigned_int>(pIVar19,1);
      if (uVar23 != uVar12) {
        local_2c8._M_unused._M_member_pointer = 0x7fffffff00000000;
        local_2c8._8_8_ = 0;
        local_2b8 = (code *)0x0;
        local_2b0 = (code *)0x7fffffff7fffffff;
        bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar23,(ImageTypeInfo *)&local_2c8);
        if (bVar6) {
          if (local_2e8._0_4_ != local_2c8._0_4_) {
LAB_0064a2ce:
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = "Image operands must match result image operands except for depth";
            lVar25 = 0x40;
            goto LAB_0064a2f5;
          }
          if (local_2e8._4_4_ != local_2c8._4_4_) goto LAB_0064a2ce;
          if (local_2e8._12_4_ != local_2c8._12_4_) goto LAB_0064a2ce;
          if ((uint)uStack_2d8 != (int)local_2b8) goto LAB_0064a2ce;
          if (uStack_2d8._4_4_ != local_2b8._4_4_) goto LAB_0064a2ce;
          if ((int)local_2d0 != (int)local_2b0) goto LAB_0064a2ce;
          if (local_2d0._4_4_ != local_2b0._4_4_) goto LAB_0064a2ce;
          bVar6 = true;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = "Corrupt image type definition";
          lVar25 = 0x1d;
LAB_0064a2f5:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,pcVar27,lVar25);
          sVar8 = local_98;
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
          bVar6 = false;
        }
        if (!bVar6) {
          return sVar8;
        }
      }
      bVar6 = spvIsVulkanEnv(_->context_->target_env);
      if (bVar6) {
        if (uStack_2d8._4_4_ == 1) goto LAB_0064a3b4;
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1a0f,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
        pcVar27 = "Expected Image \'Sampled\' parameter to be 1 for Vulkan environment.";
LAB_0064a379:
        lVar25 = 0x42;
        goto LAB_006494a5;
      }
      if (uStack_2d8._4_4_ < 2) {
LAB_0064a3b4:
        if (local_2e8._4_4_ == 6) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = "Expected Image \'Dim\' parameter to be not SubpassData.";
          goto LAB_00649760;
        }
        uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
        OVar9 = ValidationState_t::GetIdOpcode(_,uVar12);
        if (OVar9 == OpTypeSampler) {
          ValidationState_t::getSampledImageConsumers(&local_90,_,(inst->inst_).result_id);
          local_278 = (Function *)
                      local_90.
                      super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (local_90.
              super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_90.
              super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_2a0 = local_2a0 & 0xffffffff00000000;
            ppIVar30 = local_90.
                       super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            do {
              pIVar19 = *ppIVar30;
              if (pIVar19->block_ == inst->block_) {
                uVar31 = (pIVar19->inst_).opcode;
                OVar9 = (Op)uVar31;
                if ((uVar31 == 0xf5) || (uVar31 == 0xa9)) {
                  ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_268,
                             "Result <id> from OpSampledImage instruction must not appear as operands of Op"
                             ,0x4d);
                  local_270 = spvOpcodeString(OVar9);
                  pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,&local_270);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,".",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21," Found result <id> ",0x13);
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&local_2c8,_,(inst->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21," as an operand of <id> ",0x17);
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&local_298,_,(pIVar19->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21,local_298._M_p,local_290);
LAB_0064a65b:
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,".",1);
                  sVar8 = pDVar21->error_;
                  goto LAB_0064a666;
                }
                bVar32 = anon_unknown_0::IsAllowedSampledImageOperand(OVar9,_);
                bVar6 = true;
                uVar22 = extraout_var_00;
                if (!bVar32) {
                  ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_268,
                             "Result <id> from OpSampledImage instruction must not appear as operand for Op"
                             ,0x4d);
                  local_270 = spvOpcodeString(OVar9);
                  pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,&local_270);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21,", since it is not specified as taking an ",0x29);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21,"OpTypeSampledImage.",0x13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21," Found result <id> ",0x13);
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&local_2c8,_,(inst->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21," as an operand of <id> ",0x17);
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&local_298,_,(pIVar19->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar21,local_298._M_p,local_290);
                  goto LAB_0064a65b;
                }
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_268,
                           "All OpSampledImage instructions must be in the same block in which their Result <id> are consumed. OpSampledImage Result Type <id> "
                           ,0x83);
                ValidationState_t::getIdName_abi_cxx11_
                          ((string *)&local_2c8,_,(inst->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_268,
                           " has a consumer in a different basic block. The consumer instruction <id> is "
                           ,0x4d);
                ValidationState_t::getIdName_abi_cxx11_
                          ((string *)&local_298,_,(pIVar19->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_268,local_298._M_p,local_290);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,".",1);
                sVar8 = local_98;
LAB_0064a666:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_p != &aStack_288) {
                  operator_delete(local_298._M_p,aStack_288._M_allocated_capacity + 1);
                }
                if ((undefined8 *)local_2c8._M_unused._0_8_ != &local_2b8) {
                  operator_delete(local_2c8._M_unused._M_object,(ulong)(local_2b8 + 1));
                }
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
                bVar6 = false;
                uVar22 = extraout_var;
              }
              if (!bVar6) break;
              ppIVar30 = ppIVar30 + 1;
              local_2a0 = CONCAT44(local_2a0._4_4_,
                                   (int)CONCAT71(uVar22,(Function *)ppIVar30 == local_278));
            } while ((Function *)ppIVar30 != local_278);
            if ((local_2a0 & 1) == 0) goto LAB_0064adc2;
          }
          uVar12 = Instruction::GetOperandAs<int>(inst,2);
          pIVar19 = ValidationState_t::FindDef(_,uVar12);
          sVar8 = SPV_SUCCESS;
          if ((pIVar19->inst_).opcode == 0x3d) {
            uVar12 = Instruction::GetOperandAs<int>(pIVar19,2);
            ValidationState_t::RegisterQCOMImageProcessingTextureConsumer(_,uVar12,pIVar19,inst);
          }
LAB_0064adc2:
          if (local_90.
              super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.
                            super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_90.
                                  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.
                                  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            return sVar8;
          }
          return sVar8;
        }
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Sampler to be of type OpTypeSampler";
        goto LAB_00649649;
      }
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Image \'Sampled\' parameter to be 0 or 1";
      lVar25 = 0x2f;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Result Type to be OpTypeSampledImage.";
LAB_006495f6:
      lVar25 = 0x2e;
    }
    break;
  case OpImageSampleImplicitLod:
  case OpImageSampleExplicitLod:
  case OpImageSampleProjImplicitLod:
  case OpImageSampleProjExplicitLod:
switchD_006481c4_caseD_57:
    uVar31 = (inst->inst_).opcode;
    OVar9 = (Op)uVar31;
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar12 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntVectorType(_,(uint32_t)local_298._M_p);
    if ((bVar6) || (bVar6 = ValidationState_t::IsFloatVectorType(_,uVar12), bVar6)) {
      uVar13 = ValidationState_t::GetDimension(_,uVar12);
      if (uVar13 == 4) {
        uVar13 = ValidationState_t::GetOperandTypeId(_,inst,2);
        OVar14 = ValidationState_t::GetIdOpcode(_,uVar13);
        if (OVar14 != OpTypeSampledImage) goto LAB_00648bd6;
        local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
        local_2e8._8_8_ = 0;
        uStack_2d8 = (code *)0x0;
        local_2d0 = (code *)0x7fffffff7fffffff;
        bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar13,(ImageTypeInfo *)&local_2e8);
        if (!bVar6) goto LAB_00649b1c;
        bVar6 = anon_unknown_0::IsProj(OVar9);
        if ((bVar6) &&
           (sVar8 = anon_unknown_0::ValidateImageProj(_,inst,(ImageTypeInfo *)&local_2e8),
           sVar8 != SPV_SUCCESS)) {
          return sVar8;
        }
        if ((uint)uStack_2d8 != 0) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = "Sampling operation is invalid for multisample image";
          lVar25 = 0x33;
          break;
        }
        OVar14 = ValidationState_t::GetIdOpcode(_,local_2e8._0_4_);
        if (OVar14 != OpTypeVoid) {
          uVar12 = ValidationState_t::GetComponentType(_,uVar12);
          uVar5 = local_2e8._0_4_;
          sVar8 = SPV_SUCCESS;
          if (uVar12 != local_2e8._0_4_) {
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,"Expected Image \'Sampled Type\' to be the same as ",
                       0x30);
            if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
              local_2c8._M_unused._M_object =
                   (&PTR_anon_var_dwarf_2e44666_00b6ffd0)
                   [OVar9 - OpImageSparseSampleImplicitLod & 0xffff];
            }
            else {
              local_2c8._M_unused._M_object = "Result Type";
            }
            pDVar21 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_268,(char **)&local_2c8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21," components",0xb)
            ;
            sVar8 = pDVar21->error_;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
          }
          if (uVar12 != uVar5) {
            return sVar8;
          }
        }
        uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
        if (((uVar31 == 0x132) || (OVar9 == OpImageSampleExplicitLod)) &&
           (bVar6 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel),
           bVar6)) {
          bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar12);
          if ((!bVar6) && (bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12), !bVar6))
          goto LAB_0064ae89;
        }
        else {
          bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar12);
          if (!bVar6) goto LAB_0064af42;
        }
        uVar13 = anon_unknown_0::GetMinCoordSize(OVar9,(ImageTypeInfo *)&local_2e8);
        uVar12 = ValidationState_t::GetDimension(_,uVar12);
        if (uVar12 < uVar13) goto LAB_0064aee3;
        puVar4 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((0x17 < (ulong)((long)(inst->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) &&
            ((puVar4[5] & 8) != 0)) &&
           ((bVar6 = spvIsOpenCLEnv(_->context_->target_env), OVar9 == OpImageSampleExplicitLod &&
            (bVar6)))) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,"ConstOffset image operand not allowed ",0x26);
          pcVar27 = "in the OpenCL environment.";
          goto LAB_0064ac74;
        }
LAB_0064b41c:
        uVar12 = 6;
        goto LAB_0064b42a;
      }
LAB_00648b81:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Expected ",9);
      if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
        pcVar27 = (&PTR_anon_var_dwarf_2e44666_00b6ffd0)
                  [OVar9 - OpImageSparseSampleImplicitLod & 0xffff];
        val = &local_2e8;
      }
      else {
        pcVar27 = "Result Type";
      }
LAB_006494d9:
      *(char **)val = pcVar27;
      pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)val);
      pcVar27 = " to have 4 components";
      lVar25 = 0x15;
    }
    else {
LAB_00648c02:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Expected ",9);
      if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
        local_2e8._M_unused._M_object =
             (&PTR_anon_var_dwarf_2e44666_00b6ffd0)[OVar9 - OpImageSparseSampleImplicitLod & 0xffff]
        ;
      }
      else {
        local_2e8._M_unused._M_object = "Result Type";
      }
      pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)&local_2e8);
      pcVar27 = " to be int or float vector type";
LAB_006496d2:
      lVar25 = 0x1f;
    }
    goto LAB_006496d7;
  case OpImageSampleDrefImplicitLod:
  case OpImageSampleDrefExplicitLod:
  case OpImageSampleProjDrefImplicitLod:
  case OpImageSampleProjDrefExplicitLod:
switchD_006481c4_caseD_59:
    OVar9 = (Op)(inst->inst_).opcode;
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar12 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntScalarType(_,(uint32_t)local_298._M_p);
    if ((!bVar6) && (bVar6 = ValidationState_t::IsFloatScalarType(_,uVar12), !bVar6)) {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Expected ",9);
      if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
        local_2e8._M_unused._M_object =
             (&PTR_anon_var_dwarf_2e44666_00b6ffd0)[OVar9 - OpImageSparseSampleImplicitLod & 0xffff]
        ;
      }
      else {
        local_2e8._M_unused._M_object = "Result Type";
      }
      pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)&local_2e8);
      pcVar27 = " to be int or float scalar type";
      goto LAB_006496d2;
    }
    uVar13 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar14 = ValidationState_t::GetIdOpcode(_,uVar13);
    if (OVar14 != OpTypeSampledImage) {
LAB_00648bd6:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Sampled Image to be of type OpTypeSampledImage";
      goto LAB_00648bf8;
    }
    local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2e8._8_8_ = 0;
    uStack_2d8 = (code *)0x0;
    local_2d0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar13,(ImageTypeInfo *)&local_2e8);
    if (!bVar6) goto LAB_00649b1c;
    bVar6 = anon_unknown_0::IsProj(OVar9);
    if ((bVar6) &&
       (sVar8 = anon_unknown_0::ValidateImageProj(_,inst,(ImageTypeInfo *)&local_2e8),
       sVar8 != SPV_SUCCESS)) {
      return sVar8;
    }
    if ((uint)uStack_2d8 != 0) {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Dref sampling operation is invalid for multisample image";
      goto LAB_0064843b;
    }
    if (uVar12 != local_2e8._0_4_) {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"Expected Image \'Sampled Type\' to be the same as ",0x30);
      if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
        local_2c8._M_unused._M_object =
             (&PTR_anon_var_dwarf_2e44666_00b6ffd0)[OVar9 - OpImageSparseSampleImplicitLod & 0xffff]
        ;
      }
      else {
        local_2c8._M_unused._M_object = "Result Type";
      }
      pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)&local_2c8);
      local_98 = pDVar21->error_;
      goto LAB_00649b55;
    }
    uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar12);
    if (bVar6) {
      uVar13 = anon_unknown_0::GetMinCoordSize(OVar9,(ImageTypeInfo *)&local_2e8);
      uVar12 = ValidationState_t::GetDimension(_,uVar12);
      if (uVar12 < uVar13) goto LAB_0064ab22;
      goto LAB_00649998;
    }
LAB_0064af42:
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar27 = "Expected Coordinate to be float scalar or vector";
    lVar25 = 0x30;
    break;
  case OpImageFetch:
switchD_006481c4_caseD_5f:
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    OVar9 = (Op)(inst->inst_).opcode;
    uVar12 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntVectorType(_,(uint32_t)local_298._M_p);
    if ((!bVar6) && (bVar6 = ValidationState_t::IsFloatVectorType(_,uVar12), !bVar6))
    goto LAB_00648c02;
    uVar13 = ValidationState_t::GetDimension(_,uVar12);
    if (uVar13 != 4) goto LAB_00648b81;
    uVar13 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar14 = ValidationState_t::GetIdOpcode(_,uVar13);
    if (OVar14 != OpTypeImage) goto LAB_00649308;
    local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2e8._8_8_ = 0;
    uStack_2d8 = (code *)0x0;
    local_2d0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar13,(ImageTypeInfo *)&local_2e8);
    if (!bVar6) goto LAB_00649b1c;
    OVar14 = ValidationState_t::GetIdOpcode(_,local_2e8._0_4_);
    if (OVar14 != OpTypeVoid) {
      uVar12 = ValidationState_t::GetComponentType(_,uVar12);
      uVar5 = local_2e8._0_4_;
      sVar8 = SPV_SUCCESS;
      if (uVar12 != local_2e8._0_4_) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,"Expected Image \'Sampled Type\' to be the same as ",0x30);
        if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
          local_2c8._M_unused._M_object =
               (&PTR_anon_var_dwarf_2e44666_00b6ffd0)
               [OVar9 - OpImageSparseSampleImplicitLod & 0xffff];
        }
        else {
          local_2c8._M_unused._M_object = "Result Type";
        }
        pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)&local_2c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21," components",0xb);
        sVar8 = pDVar21->error_;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
      }
      if (uVar12 != uVar5) {
        return sVar8;
      }
    }
    if (local_2e8._4_4_ == 3) {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Image \'Dim\' cannot be Cube";
LAB_0064ac74:
      lVar25 = 0x1a;
      break;
    }
    if (uStack_2d8._4_4_ != 1) {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Image \'Sampled\' parameter to be 1";
      goto LAB_00648b15;
    }
    uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12);
    if (!bVar6) goto LAB_0064b434;
    uVar13 = anon_unknown_0::GetMinCoordSize(OVar9,(ImageTypeInfo *)&local_2e8);
    uVar12 = ValidationState_t::GetDimension(_,uVar12);
    if (uVar13 <= uVar12) goto LAB_0064b41c;
LAB_0064aee3:
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"Expected Coordinate to have at least ",0x25);
    std::ostream::_M_insert<unsigned_long>((ulong)local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268," components, but given only ",0x1c);
LAB_0064af35:
    std::ostream::_M_insert<unsigned_long>((ulong)local_268);
    goto LAB_00649b55;
  case OpImageGather:
  case OpImageDrefGather:
switchD_006481c4_caseD_60:
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    OVar9 = (Op)(inst->inst_).opcode;
    uVar12 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntVectorType(_,(uint32_t)local_298._M_p);
    if ((!bVar6) && (bVar6 = ValidationState_t::IsFloatVectorType(_,uVar12), !bVar6))
    goto LAB_00648c02;
    uVar13 = ValidationState_t::GetDimension(_,uVar12);
    if (uVar13 != 4) goto LAB_00648b81;
    uVar13 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar14 = ValidationState_t::GetIdOpcode(_,uVar13);
    if (OVar14 != OpTypeSampledImage) goto LAB_00648bd6;
    local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2e8._8_8_ = 0;
    uStack_2d8 = (code *)0x0;
    local_2d0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar13,(ImageTypeInfo *)&local_2e8);
    if (!bVar6) goto LAB_00649b1c;
    if ((uint)uStack_2d8 != 0) {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Gather operation is invalid for multisample image";
      lVar25 = 0x31;
      break;
    }
    sVar8 = SPV_SUCCESS;
    if ((OVar9 == OpImageDrefGather) || (OVar9 == OpImageSparseDrefGather)) {
LAB_0064a065:
      uVar12 = ValidationState_t::GetComponentType(_,uVar12);
      uVar5 = local_2e8._0_4_;
      if (uVar12 != local_2e8._0_4_) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,"Expected Image \'Sampled Type\' to be the same as ",0x30);
        if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
          local_2c8._M_unused._M_object =
               (&PTR_anon_var_dwarf_2e44666_00b6ffd0)
               [OVar9 - OpImageSparseSampleImplicitLod & 0xffff];
        }
        else {
          local_2c8._M_unused._M_object = "Result Type";
        }
        pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)&local_2c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21," components",0xb);
        sVar8 = pDVar21->error_;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
      }
      if (uVar12 != uVar5) {
        return sVar8;
      }
    }
    else {
      OVar14 = ValidationState_t::GetIdOpcode(_,local_2e8._0_4_);
      if (OVar14 != OpTypeVoid) goto LAB_0064a065;
    }
    if (((uint)local_2e8._4_4_ < 5) && ((0x1aU >> (local_2e8._4_4_ & 0x1f) & 1) != 0)) {
      uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar12);
      if (!bVar6) goto LAB_0064af42;
      uVar13 = anon_unknown_0::GetMinCoordSize(OVar9,(ImageTypeInfo *)&local_2e8);
      uVar12 = ValidationState_t::GetDimension(_,uVar12);
      if (uVar12 < uVar13) goto LAB_0064ab22;
      if (OVar9 < OpImageSparseGather) {
        if (OVar9 != OpImageGather) {
          if (OVar9 != OpImageDrefGather) {
LAB_0064bc55:
            __assert_fail("opcode == spv::Op::OpImageDrefGather || opcode == spv::Op::OpImageSparseDrefGather"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                          ,0x65c,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageGather(ValidationState_t &, const Instruction *)"
                         );
          }
          goto LAB_00649998;
        }
LAB_0064b475:
        uVar23 = Instruction::GetOperandAs<unsigned_int>(inst,4);
        uVar12 = ValidationState_t::GetTypeId(_,uVar23);
        bVar6 = ValidationState_t::IsIntScalarType(_,uVar12);
        if ((bVar6) && (uVar12 = ValidationState_t::GetBitWidth(_,uVar12), uVar12 == 0x20)) {
          bVar32 = spvIsVulkanEnv(_->context_->target_env);
          bVar6 = true;
          if (bVar32) {
            OVar9 = ValidationState_t::GetIdOpcode(_,uVar23);
            iVar15 = spvOpcodeIsConstant(OVar9);
            if (iVar15 == 0) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1238,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,
                         "Expected Component Operand to be a const object for Vulkan environment",
                         0x46);
              sVar8 = local_98;
              if ((undefined8 *)local_2c8._M_unused._0_8_ != &local_2b8) {
                operator_delete(local_2c8._M_unused._M_object,(ulong)(local_2b8 + 1));
              }
              goto LAB_0064b5dd;
            }
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,"Expected Component to be 32-bit int scalar",0x2a);
          sVar8 = local_98;
LAB_0064b5dd:
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
          bVar6 = false;
        }
        if (!bVar6) {
          return sVar8;
        }
      }
      else {
        if (OVar9 != OpImageSparseDrefGather) {
          if (OVar9 != OpImageSparseGather) goto LAB_0064bc55;
          goto LAB_0064b475;
        }
LAB_00649998:
        sVar8 = anon_unknown_0::ValidateImageDref(_,inst,(ImageTypeInfo *)&local_2e8);
        if (sVar8 != SPV_SUCCESS) {
          return sVar8;
        }
      }
      uVar12 = 7;
LAB_0064b42a:
      sVar8 = anon_unknown_0::ValidateImageOperands(_,inst,(ImageTypeInfo *)&local_2e8,uVar12);
      return sVar8;
    }
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x12a9,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
    pcVar27 = "Expected Image \'Dim\' to be 2D, Cube, or Rect";
    lVar25 = 0x2c;
LAB_006494a5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,pcVar27,lVar25);
    pcVar28 = local_2b8;
    uVar29 = local_2c8._M_unused._0_8_;
    if ((undefined8 *)local_2c8._M_unused._0_8_ != &local_2b8) {
LAB_00649ed7:
      operator_delete((void *)uVar29,(ulong)(pcVar28 + 1));
    }
    goto LAB_00649b55;
  case OpImageRead:
switchD_006481c4_caseD_62:
    uVar31 = (inst->inst_).opcode;
    local_298._M_p = (pointer)((ulong)local_298._M_p._4_4_ << 0x20);
    sVar8 = anon_unknown_0::GetActualResultType(_,inst,(uint32_t *)&local_298);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar12 = (uint32_t)local_298._M_p;
    bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,(uint32_t)local_298._M_p);
    if ((bVar6) || (bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar12), bVar6)) {
      sVar3 = _->context_->target_env;
      local_2a0 = (ulong)uVar31;
      bVar6 = spvIsVulkanEnv(sVar3);
      if ((bVar6) && (uVar13 = ValidationState_t::GetDimension(_,uVar12), uVar13 != 4)) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2e8,_,0x12ac,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,(char *)local_2e8._M_unused._0_8_,local_2e8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Expected ",9);
        uVar23 = (int)local_2a0 - 0x131;
        if ((ushort)uVar23 < 0x10) {
          local_2c8._M_unused._M_object = (&PTR_anon_var_dwarf_2e44666_00b6ffd0)[uVar23 & 0xffff];
        }
        else {
          local_2c8._M_unused._M_object = "Result Type";
        }
        pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)&local_2c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar21," to have 4 components",0x15);
        pcVar28 = uStack_2d8;
        uVar29 = local_2e8._M_unused._0_8_;
        local_98 = pDVar21->error_;
        if ((undefined8 *)local_2e8._M_unused._0_8_ != &uStack_2d8) goto LAB_00649ed7;
      }
      else {
        uVar13 = ValidationState_t::GetOperandTypeId(_,inst,2);
        OVar9 = ValidationState_t::GetIdOpcode(_,uVar13);
        if (OVar9 != OpTypeImage) goto LAB_00649308;
        local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
        local_2e8._8_8_ = 0;
        uStack_2d8 = (code *)0x0;
        local_2d0 = (code *)0x7fffffff7fffffff;
        bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar13,(ImageTypeInfo *)&local_2e8);
        if (!bVar6) goto LAB_00649b1c;
        bVar6 = spvIsOpenCLEnv(sVar3);
        OVar9 = (Op)local_2a0;
        sVar8 = SPV_SUCCESS;
        if (bVar6) {
          if (local_2e8._8_4_ == 0) {
            uVar13 = ValidationState_t::GetDimension(_,uVar12);
            if (uVar13 != 4) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Expected ",9)
              ;
              if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
                pcVar27 = (&PTR_anon_var_dwarf_2e44666_00b6ffd0)
                          [OVar9 - OpImageSparseSampleImplicitLod & 0xffff];
              }
              else {
                pcVar27 = "Result Type";
              }
              val = &local_2c8;
              goto LAB_006494d9;
            }
          }
          else {
            bVar6 = ValidationState_t::IsFloatScalarType(_,uVar12);
            if (!bVar6) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Expected ",9)
              ;
              if ((ushort)(OVar9 - OpImageSparseSampleImplicitLod) < 0x10) {
                local_2c8._M_unused._M_object =
                     (&PTR_anon_var_dwarf_2e44666_00b6ffd0)
                     [OVar9 - OpImageSparseSampleImplicitLod & 0xffff];
              }
              else {
                local_2c8._M_unused._M_object = "Result Type";
              }
              pDVar21 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_268,(char **)&local_2c8);
              pcVar27 = " from a depth image read to result in a scalar float value";
              lVar25 = 0x3a;
              goto LAB_006496d7;
            }
          }
          puVar4 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          bVar6 = true;
          if (0x17 < (ulong)((long)(inst->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) {
            bVar6 = (puVar4[5] & 8) == 0;
          }
          if (!bVar6) {
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,"ConstOffset image operand not allowed ",0x26);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,"in the OpenCL environment.",0x1a);
            sVar8 = local_98;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
          }
          OVar9 = (Op)local_2a0;
          if (!bVar6) {
            return sVar8;
          }
        }
        if (local_2e8._4_4_ == 6) {
          if (OVar9 == OpImageSparseRead) {
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = "Image Dim SubpassData cannot be used with ImageSparseRead";
            lVar25 = 0x39;
            break;
          }
          local_278 = ValidationState_t::function(_,inst->function_->id_);
          local_2c8._M_unused._M_object = &local_2b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c8,"Dim SubpassData requires Fragment execution model: ","");
          spvOpcodeString(OVar9);
          plVar20 = (long *)std::__cxx11::string::append(local_2c8._M_pod_data);
          psVar24 = (size_type *)(plVar20 + 2);
          if ((size_type *)*plVar20 == psVar24) {
            local_268._16_8_ = *psVar24;
            local_268._24_8_ = plVar20[3];
            local_268._0_8_ = local_268 + 0x10;
          }
          else {
            local_268._16_8_ = *psVar24;
            local_268._0_8_ = (size_type *)*plVar20;
          }
          local_268._8_8_ = plVar20[1];
          *plVar20 = (long)psVar24;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          Function::RegisterExecutionModelLimitation
                    (local_278,ExecutionModelFragment,(string *)local_268);
          if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
            operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
          }
          OVar9 = (Op)local_2a0;
          if ((undefined8 *)local_2c8._M_unused._0_8_ != &local_2b8) {
            operator_delete(local_2c8._M_unused._M_object,(ulong)(local_2b8 + 1));
          }
        }
        if (local_2e8._4_4_ != 0x104d) {
          OVar14 = ValidationState_t::GetIdOpcode(_,local_2e8._0_4_);
          if (OVar14 != OpTypeVoid) {
            uVar12 = ValidationState_t::GetComponentType(_,uVar12);
            uVar5 = local_2e8._0_4_;
            if (uVar12 != local_2e8._0_4_) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,"Expected Image \'Sampled Type\' to be the same as ",
                         0x30);
              uVar23 = (int)local_2a0 - 0x131;
              if ((ushort)uVar23 < 0x10) {
                local_2c8._M_unused._M_object =
                     (&PTR_anon_var_dwarf_2e44666_00b6ffd0)[uVar23 & 0xffff];
              }
              else {
                local_2c8._M_unused._M_object = "Result Type";
              }
              pDVar21 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_268,(char **)&local_2c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar21," components",0xb);
              sVar8 = pDVar21->error_;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
              OVar9 = (Op)local_2a0;
            }
            if (uVar12 != uVar5) {
              return sVar8;
            }
          }
          sVar8 = anon_unknown_0::ValidateImageReadWrite(_,inst,(ImageTypeInfo *)&local_2e8);
          if (sVar8 != SPV_SUCCESS) {
            return sVar8;
          }
          uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
          bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12);
          if (!bVar6) {
LAB_0064b434:
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = "Expected Coordinate to be int scalar or vector";
            goto LAB_006495f6;
          }
          uVar13 = anon_unknown_0::GetMinCoordSize(OVar9,(ImageTypeInfo *)&local_2e8);
          uVar12 = ValidationState_t::GetDimension(_,uVar12);
          if (uVar12 < uVar13) goto LAB_0064aee3;
          bVar6 = spvIsVulkanEnv(_->context_->target_env);
          if ((((!bVar6) || ((int)local_2d0 != 0)) || (local_2e8._4_4_ == 6)) ||
             (bVar6 = EnumSet<spv::Capability>::contains
                                (&_->module_capabilities_,CapabilityStorageImageReadWithoutFormat),
             bVar6)) goto LAB_0064b41c;
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,"Capability StorageImageReadWithoutFormat is required to "
                     ,0x38);
          pcVar27 = "read storage image";
          lVar25 = 0x12;
          break;
        }
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,"Image Dim TileImageDataEXT cannot be used with ",0x2f);
        local_2c8._M_unused._0_8_ = (undefined8)spvOpcodeString(OVar9);
        pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)&local_2c8);
        local_98 = pDVar21->error_;
      }
      goto LAB_00649b55;
    }
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Expected ",9);
    uVar31 = uVar31 - 0x131;
    if (uVar31 < 0x10) {
      local_2e8._M_unused._M_object = (&PTR_anon_var_dwarf_2e44666_00b6ffd0)[uVar31];
    }
    else {
      local_2e8._M_unused._M_object = "Result Type";
    }
    pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_268,(char **)&local_2e8);
    pcVar27 = " to be int or float scalar or vector type";
    lVar25 = 0x29;
LAB_006496d7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,pcVar27,lVar25);
    local_98 = pDVar21->error_;
    goto LAB_00649b55;
  case OpImageWrite:
    uVar12 = ValidationState_t::GetOperandTypeId(_,inst,0);
    OVar9 = ValidationState_t::GetIdOpcode(_,uVar12);
    if (OVar9 == OpTypeImage) {
      local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
      local_2e8._8_8_ = 0;
      uStack_2d8 = (code *)0x0;
      local_2d0 = (code *)0x7fffffff7fffffff;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar12,(ImageTypeInfo *)&local_2e8);
      if (!bVar6) goto LAB_00649b1c;
      if (local_2e8._4_4_ == 0x104d) {
LAB_0064976a:
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Image \'Dim\' cannot be TileImageDataEXT";
        goto LAB_0064978c;
      }
      if (local_2e8._4_4_ == 6) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Image \'Dim\' cannot be SubpassData";
        lVar25 = 0x21;
        break;
      }
      sVar8 = anon_unknown_0::ValidateImageReadWrite(_,inst,(ImageTypeInfo *)&local_2e8);
      if (sVar8 != SPV_SUCCESS) {
        return sVar8;
      }
      uVar12 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12);
      if (!bVar6) goto LAB_0064b434;
      uVar13 = anon_unknown_0::GetMinCoordSize
                         ((uint)(inst->inst_).opcode,(ImageTypeInfo *)&local_2e8);
      uVar12 = ValidationState_t::GetDimension(_,uVar12);
      if (uVar13 <= uVar12) {
        uVar12 = ValidationState_t::GetOperandTypeId(_,inst,2);
        bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12);
        if ((bVar6) || (bVar6 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar12), bVar6)) {
          OVar9 = ValidationState_t::GetIdOpcode(_,local_2e8._0_4_);
          if (OVar9 != OpTypeVoid) {
            uVar12 = ValidationState_t::GetComponentType(_,uVar12);
            if (uVar12 != local_2e8._0_4_) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,
                         "Expected Image \'Sampled Type\' to be the same as Texel ",0x36);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,"components",10);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
              return local_98;
            }
          }
          bVar6 = spvIsVulkanEnv(_->context_->target_env);
          if ((((!bVar6) || ((int)local_2d0 != 0)) || (local_2e8._4_4_ == 6)) ||
             (bVar6 = EnumSet<spv::Capability>::contains
                                (&_->module_capabilities_,CapabilityStorageImageWriteWithoutFormat),
             bVar6)) {
            if (((ulong)((long)(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) < 0x11) ||
               (bVar6 = spvIsOpenCLEnv(_->context_->target_env), !bVar6)) {
              uVar12 = 5;
              goto LAB_0064b42a;
            }
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,"Optional Image Operands are not allowed in the OpenCL "
                       ,0x36);
            pcVar27 = "environment.";
            lVar25 = 0xc;
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,
                       "Capability StorageImageWriteWithoutFormat is required to write ",0x3f);
            pcVar27 = "to storage image";
            lVar25 = 0x10;
          }
          break;
        }
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Texel to be int or float vector or scalar";
LAB_0064b6a0:
        lVar25 = 0x32;
        break;
      }
LAB_0064ab22:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"Expected Coordinate to have at least ",0x25);
      std::ostream::_M_insert<unsigned_long>((ulong)local_268);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268," components, but given only ",0x1c);
      goto LAB_0064af35;
    }
LAB_00649308:
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar27 = "Expected Image to be of type OpTypeImage";
    lVar25 = 0x28;
    break;
  case OpImage:
    uVar12 = (inst->inst_).type_id;
    OVar9 = ValidationState_t::GetIdOpcode(_,uVar12);
    if (OVar9 == OpTypeImage) {
      uVar13 = ValidationState_t::GetOperandTypeId(_,inst,2);
      pIVar19 = ValidationState_t::FindDef(_,uVar13);
      if (pIVar19 == (Instruction *)0x0) {
        __assert_fail("sampled_image_type_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                      ,0x745,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateImage(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((pIVar19->inst_).opcode == 0x1b) {
        if ((pIVar19->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[2] == uVar12) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Sample Image image type to be equal to Result Type";
LAB_00648d2d:
        lVar25 = 0x3b;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Sample Image to be of type OpTypeSampleImage";
LAB_00649760:
        lVar25 = 0x35;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Result Type to be OpTypeImage";
LAB_0064978c:
      lVar25 = 0x26;
    }
    break;
  case OpImageQueryFormat:
  case OpImageQueryOrder:
    bVar6 = ValidationState_t::IsIntScalarType(_,(inst->inst_).type_id);
    if (bVar6) {
      uVar12 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar9 = ValidationState_t::GetIdOpcode(_,uVar12);
      if (OVar9 == OpTypeImage) {
        local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
        local_2e8._8_8_ = 0;
        uStack_2d8 = (code *)0x0;
        local_2d0 = (code *)0x7fffffff7fffffff;
        bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar12,(ImageTypeInfo *)&local_2e8);
        if (bVar6) {
          if (local_2e8._4_4_ != 0x104d) {
            return SPV_SUCCESS;
          }
          goto LAB_0064976a;
        }
        goto LAB_00649b1c;
      }
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected operand to be of type OpTypeImage";
    }
    else {
LAB_00648af3:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Result Type to be int scalar type";
    }
LAB_00648b15:
    lVar25 = 0x2a;
    break;
  case OpImageQuerySizeLod:
    uVar12 = (inst->inst_).type_id;
    bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12);
    if (!bVar6) {
LAB_00649334:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Result Type to be int scalar or vector type";
      goto LAB_00649356;
    }
    uVar13 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar9 = ValidationState_t::GetIdOpcode(_,uVar13);
    if (OVar9 != OpTypeImage) goto LAB_00649308;
    local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2e8._8_8_ = 0;
    uStack_2d8 = (code *)0x0;
    local_2d0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar13,(ImageTypeInfo *)&local_2e8);
    if (!bVar6) goto LAB_00649b1c;
    if (3 < local_2e8._M_unused._M_member_pointer >> 0x20) {
LAB_0064916b:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Image \'Dim\' must be 1D, 2D, 3D or Cube";
      goto LAB_0064978c;
    }
    if ((uint)uStack_2d8 == 0) {
      uVar13 = local_2e8._12_4_ +
               *(int *)(&DAT_00903b40 + (local_2e8._M_unused._M_member_pointer >> 0x20) * 4);
      bVar6 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar6) && (uStack_2d8._4_4_ != 1)) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1233,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
        pcVar27 = 
        "OpImageQuerySizeLod must only consume an \"Image\" operand whose type has its \"Sampled\" operand set to 1"
        ;
        lVar25 = 0x66;
        goto LAB_006494a5;
      }
      uVar12 = ValidationState_t::GetDimension(_,uVar12);
      if (uVar12 != uVar13) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,"Result Type has ",0x10);
        std::ostream::_M_insert<unsigned_long>((ulong)local_268);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268," components, ",0xd)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"but ",4);
        goto LAB_0064b19f;
      }
      uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar6 = ValidationState_t::IsIntScalarType(_,uVar12);
      if (bVar6) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Level of Detail to be int scalar";
      goto LAB_00649734;
    }
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar27 = "Image \'MS\' must be 0";
LAB_0064a2c4:
    lVar25 = 0x14;
    break;
  case OpImageQuerySize:
    uVar12 = (inst->inst_).type_id;
    bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12);
    if (!bVar6) goto LAB_00649334;
    uVar13 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar9 = ValidationState_t::GetIdOpcode(_,uVar13);
    if (OVar9 != OpTypeImage) goto LAB_00649308;
    local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2e8._8_8_ = 0;
    uStack_2d8 = (code *)0x0;
    local_2d0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar13,(ImageTypeInfo *)&local_2e8);
    if (!bVar6) goto LAB_00649b1c;
    if ((ulong)(uint)local_2e8._4_4_ < 6) {
      uVar13 = local_2e8._12_4_ + *(int *)(&DAT_00903c50 + (ulong)(uint)local_2e8._4_4_ * 4);
      if ((((uint)local_2e8._4_4_ < 4) && ((uint)uStack_2d8 != 1)) &&
         (((ulong)uStack_2d8 & 0xfffffffd00000000) != 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Image must have either \'MS\'=1 or \'Sampled\'=0 or \'Sampled\'=2";
        goto LAB_00648d2d;
      }
      uVar12 = ValidationState_t::GetDimension(_,uVar12);
      if (uVar12 == uVar13) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"Result Type has ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)local_268);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268," components, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"but ",4);
LAB_0064b19f:
      std::ostream::_M_insert<unsigned_long>((ulong)local_268);
      pcVar27 = " expected";
      lVar25 = 9;
      break;
    }
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar27 = "Image \'Dim\' must be 1D, Buffer, 2D, Cube, 3D or Rect";
LAB_00649356:
    lVar25 = 0x34;
    break;
  case OpImageQueryLod:
    pFVar16 = ValidationState_t::function(_,inst->function_->id_);
    local_2e8._M_unused._M_object = (_func_void *)0x0;
    local_2e8._8_8_ = 0;
    local_2d0 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2029:11)>
                ::_M_invoke;
    uStack_2d8 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2029:11)>
                 ::_M_manager;
    p_Var17 = std::__cxx11::
              list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                          *)&pFVar16->execution_model_limitations_,
                         (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_2e8);
    std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
    psVar1 = &(pFVar16->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (uStack_2d8 != (code *)0x0) {
      (*uStack_2d8)(&local_2e8,&local_2e8,3);
    }
    pFVar16 = ValidationState_t::function(_,inst->function_->id_);
    local_2c8._M_unused._M_object = (_func_void *)0x0;
    local_2c8._8_8_ = 0;
    local_2b0 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2044:28)>
                ::_M_invoke;
    local_2b8 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp:2044:28)>
                ::_M_manager;
    p_Var18 = std::__cxx11::
              list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
              ::
              _M_create_node<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
                          *)&pFVar16->limitations_,
                         (function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_2c8);
    std::__detail::_List_node_base::_M_hook(&p_Var18->super__List_node_base);
    psVar1 = &(pFVar16->limitations_).
              super__List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_2b8 != (code *)0x0) {
      (*local_2b8)(&local_2c8,&local_2c8,3);
    }
    uVar12 = (inst->inst_).type_id;
    bVar6 = ValidationState_t::IsFloatVectorType(_,uVar12);
    if (bVar6) {
      uVar12 = ValidationState_t::GetDimension(_,uVar12);
      if (uVar12 != 2) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Result Type to have 2 components";
        goto LAB_00649734;
      }
      uVar12 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar9 = ValidationState_t::GetIdOpcode(_,uVar12);
      if (OVar9 == OpTypeSampledImage) {
        local_298._M_p = (char *)0x7fffffff00000000;
        local_290 = 0;
        aStack_288._M_allocated_capacity = 0;
        aStack_288._8_4_ = ImageFormatMax;
        aStack_288._12_4_ = AccessQualifierMax;
        bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar12,(ImageTypeInfo *)&local_298);
        if (!bVar6) goto LAB_00649b1c;
        if (Cube < local_298._M_p._4_4_) goto LAB_0064916b;
        uVar12 = ValidationState_t::GetOperandTypeId(_,inst,3);
        bVar6 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
        bVar32 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar12);
        if (!bVar6) {
          if (bVar32) goto LAB_0064a971;
          goto LAB_0064af42;
        }
        if ((bVar32) || (bVar6 = ValidationState_t::IsIntScalarOrVectorType(_,uVar12), bVar6)) {
LAB_0064a971:
          uVar13 = anon_unknown_0::GetPlaneCoordSize((ImageTypeInfo *)&local_298);
          uVar12 = ValidationState_t::GetDimension(_,uVar12);
          if (uVar13 <= uVar12) {
            return SPV_SUCCESS;
          }
          goto LAB_0064ab22;
        }
LAB_0064ae89:
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Coordinate to be int or float scalar or vector";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Expected Image operand to be of type OpTypeSampledImage";
      }
LAB_00648bf8:
      lVar25 = 0x37;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Expected Result Type to be float vector type";
LAB_00649649:
      lVar25 = 0x2c;
    }
    break;
  case OpImageQueryLevels:
  case OpImageQuerySamples:
    bVar6 = ValidationState_t::IsIntScalarType(_,(inst->inst_).type_id);
    if (!bVar6) goto LAB_00648af3;
    sVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
    OVar9 = ValidationState_t::GetIdOpcode(_,sVar8);
    if (OVar9 != OpTypeImage) goto LAB_00649308;
    local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2e8._8_8_ = 0;
    uStack_2d8 = (code *)0x0;
    local_2d0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo(_,sVar8,(ImageTypeInfo *)&local_2e8);
    if (!bVar6) goto LAB_00649b1c;
    uVar2 = (inst->inst_).opcode;
    if (uVar2 != 0x6b) {
      if (uVar2 != 0x6a) {
        __assert_fail("opcode == spv::Op::OpImageQuerySamples",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                      ,0x87c,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageQueryLevelsOrSamples(ValidationState_t &, const Instruction *)"
                     );
      }
      if ((uint)local_2e8._4_4_ < 4) {
        bVar6 = spvIsVulkanEnv(_->context_->target_env);
        bVar32 = uStack_2d8._4_4_ != 1;
        if (bVar32 && bVar6) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1233,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,
                     "OpImageQueryLevels must only consume an \"Image\" operand whose type has its \"Sampled\" operand set to 1"
                     ,0x65);
          if ((undefined8 *)local_2c8._M_unused._0_8_ != &local_2b8) {
            operator_delete(local_2c8._M_unused._M_object,(ulong)(local_2b8 + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
          sVar8 = local_98;
        }
        if (!bVar32 || !bVar6) {
          return SPV_SUCCESS;
        }
        return sVar8;
      }
      goto LAB_0064916b;
    }
    if (local_2e8._4_4_ == 1) {
      if ((uint)uStack_2d8 == 1) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Image \'MS\' must be 1";
      goto LAB_0064a2c4;
    }
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar27 = "Image \'Dim\' must be 2D";
    lVar25 = 0x16;
    break;
  default:
    if (OVar9 != OpTypeImage) {
      if (OVar9 != OpTypeSampledImage) {
        return SPV_SUCCESS;
      }
      uVar12 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[2];
      OVar9 = ValidationState_t::GetIdOpcode(_,uVar12);
      if (OVar9 != OpTypeImage) goto LAB_00649308;
      local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
      local_2e8._8_8_ = 0;
      uStack_2d8 = (code *)0x0;
      local_2d0 = (code *)0x7fffffff7fffffff;
      bVar6 = anon_unknown_0::GetImageTypeInfo(_,uVar12,(ImageTypeInfo *)&local_2e8);
      if (!bVar6) goto LAB_00649b1c;
      if (uStack_2d8._4_4_ < 2) {
        if (_->version_ < 0x10600) {
          return SPV_SUCCESS;
        }
        if (local_2e8._4_4_ != 5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_ID,inst);
        pcVar27 = "In SPIR-V 1.6 or later, sampled image dimension must not be Buffer";
LAB_0064993d:
        lVar25 = 0x42;
        break;
      }
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1231,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
      pcVar27 = "Sampled image type requires an image type with \"Sampled\" operand set to 0 or 1";
      lVar25 = 0x4e;
      goto LAB_006494a5;
    }
    if ((inst->inst_).type_id != 0) {
      __assert_fail("inst->type_id() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                    ,0x307,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateTypeImage(ValidationState_t &, const Instruction *)"
                   );
    }
    local_2e8._M_unused._M_member_pointer = 0x7fffffff00000000;
    local_2e8._8_8_ = 0;
    uStack_2d8 = (code *)0x0;
    local_2d0 = (code *)0x7fffffff7fffffff;
    bVar6 = anon_unknown_0::GetImageTypeInfo
                      (_,(inst->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[1],(ImageTypeInfo *)&local_2e8);
    if (!bVar6) {
LAB_00649b1c:
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = "Corrupt image type definition";
      lVar25 = 0x1d;
      break;
    }
    bVar6 = ValidationState_t::IsIntScalarType(_,local_2e8._0_4_);
    if (bVar6) {
      uVar12 = ValidationState_t::GetBitWidth(_,local_2e8._0_4_);
      if ((uVar12 == 0x40) &&
         (bVar6 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityInt64ImageEXT), !bVar6)) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Capability Int64ImageEXT is required when using Sampled Type of 64-bit int";
        lVar25 = 0x4a;
        break;
      }
    }
    sVar3 = _->context_->target_env;
    bVar6 = spvIsVulkanEnv(sVar3);
    if (bVar6) {
      bVar6 = ValidationState_t::IsFloatScalarType(_,local_2e8._0_4_);
      if (!bVar6) {
        bVar6 = ValidationState_t::IsIntScalarType(_,local_2e8._0_4_);
        if (bVar6) goto LAB_00649411;
LAB_00649458:
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1230,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
        pcVar27 = 
        "Expected Sampled Type to be a 32-bit int, 64-bit int or 32-bit float scalar type for Vulkan environment"
        ;
        lVar25 = 0x67;
        goto LAB_006494a5;
      }
LAB_00649411:
      uVar12 = ValidationState_t::GetBitWidth(_,local_2e8._0_4_);
      if (uVar12 != 0x20) {
        uVar12 = ValidationState_t::GetBitWidth(_,local_2e8._0_4_);
        if (uVar12 != 0x40) goto LAB_00649458;
      }
      uVar12 = ValidationState_t::GetBitWidth(_,local_2e8._0_4_);
      if (uVar12 == 0x40) {
        bVar6 = ValidationState_t::IsFloatScalarType(_,local_2e8._0_4_);
        if (bVar6) goto LAB_00649458;
      }
    }
    else {
      bVar6 = spvIsOpenCLEnv(sVar3);
      if (bVar6) {
        bVar6 = ValidationState_t::IsVoidType(_,local_2e8._0_4_);
        if (!bVar6) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = "Sampled Type must be OpTypeVoid in the OpenCL environment.";
          lVar25 = 0x3a;
          break;
        }
      }
      else {
        OVar9 = ValidationState_t::GetIdOpcode(_,local_2e8._0_4_);
        if ((OpTypeFloat < OVar9) || ((0x680000U >> (OVar9 & OpTypeOpaque) & 1) == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,"Expected Sampled Type to be either void or",0x2a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268," numerical scalar type",0x16);
          sVar10 = local_98;
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
        }
        if (OpTypeFloat < OVar9) {
          return sVar10;
        }
        if ((0x680000U >> (OVar9 & OpTypeOpaque) & 1) == 0) {
          return sVar10;
        }
      }
    }
    if (2 < (uint)local_2e8._8_4_) {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Invalid Depth ",0xe);
LAB_00649c54:
      std::ostream::_M_insert<unsigned_long>((ulong)local_268);
      pcVar27 = " (must be 0, 1 or 2)";
      goto LAB_0064a2c4;
    }
    if ((uint)local_2e8._12_4_ < 2) {
      if (1 < (uint)uStack_2d8) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"Invalid MS ",0xb);
        goto LAB_0064a15c;
      }
      if (2 < uStack_2d8._4_4_) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,"Invalid Sampled ",0x10);
        goto LAB_00649c54;
      }
      if (local_2e8._4_4_ == 0x104d) {
        bVar6 = ValidationState_t::IsVoidType(_,local_2e8._0_4_);
        if (bVar6) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = "Dim TileImageDataEXT requires Sampled Type to be not OpTypeVoid";
          lVar25 = 0x3f;
        }
        else {
          if (uStack_2d8._4_4_ == 2) {
            if ((int)local_2d0 != 0) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Dim TileImageDataEXT requires format Unknown";
              goto LAB_00649649;
            }
            if (local_2e8._8_4_ != 0) {
              ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Dim TileImageDataEXT requires Depth to be 0";
              goto LAB_006495a3;
            }
            if (local_2e8._12_4_ == 0) goto LAB_0064b256;
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = "Dim TileImageDataEXT requires Arrayed to be 0";
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = "Dim TileImageDataEXT requires Sampled to be 2";
          }
          lVar25 = 0x2d;
        }
        break;
      }
      if (local_2e8._4_4_ == 6) {
        if (uStack_2d8._4_4_ != 2) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1846,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
          pcVar27 = "Dim SubpassData requires Sampled to be 2";
          lVar25 = 0x28;
          goto LAB_006494a5;
        }
        if ((int)local_2d0 != 0) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = "Dim SubpassData requires format Unknown";
          goto LAB_00648cae;
        }
      }
      else if ((uStack_2d8._4_4_ == 2 && (uint)uStack_2d8 != 0) &&
              (bVar6 = EnumSet<spv::Capability>::contains
                                 (&_->module_capabilities_,CapabilityStorageImageMultisample),
              !bVar6)) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = 
        "Capability StorageImageMultisample is required when using multisampled storage image";
        lVar25 = 0x54;
        break;
      }
LAB_0064b256:
      bVar6 = spvIsOpenCLEnv(sVar3);
      if (!bVar6) {
LAB_0064b8b4:
        bVar6 = spvIsVulkanEnv(sVar3);
        if (!bVar6) {
          return SPV_SUCCESS;
        }
        if (uStack_2d8._4_4_ == 0) {
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1231,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
          pcVar27 = "Sampled must be 1 or 2 in the Vulkan environment.";
          lVar25 = 0x31;
        }
        else {
          if ((local_2e8._4_4_ == 6) && (local_2e8._12_4_ != 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x1846,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
            pcVar27 = "Dim SubpassData requires Arrayed to be 0 in the Vulkan environment";
            goto LAB_0064a379;
          }
          if (local_2e8._4_4_ != 4) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2c8,_,0x25a6,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_268,(char *)local_2c8._M_unused._0_8_,local_2c8._8_8_);
          pcVar27 = "Dim must not be Rect in the Vulkan environment";
          lVar25 = 0x2e;
        }
        goto LAB_006494a5;
      }
      if ((local_2e8._12_4_ == 1) && (1 < (uint)local_2e8._4_4_)) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268,"In the OpenCL environment, Arrayed may only be set to 1 ",
                   0x38);
        pcVar27 = "when Dim is either 1D or 2D.";
        lVar25 = 0x1c;
        break;
      }
      if ((uint)uStack_2d8 != 0) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "MS must be 0 in the OpenCL environment.";
        goto LAB_00648cae;
      }
      if (uStack_2d8._4_4_ != 0) {
        ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Sampled must be 0 in the OpenCL environment.";
        goto LAB_00649649;
      }
      if (local_2d0._4_4_ != 0x7fffffff) goto LAB_0064b8b4;
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"In the OpenCL environment, the optional Access Qualifier",
                 0x38);
      pcVar27 = " must be present.";
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"Invalid Arrayed ",0x10);
LAB_0064a15c:
      std::ostream::_M_insert<unsigned_long>((ulong)local_268);
      pcVar27 = " (must be 0 or 1)";
    }
    lVar25 = 0x11;
  }
LAB_00649b43:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,pcVar27,lVar25);
LAB_00649b55:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_268);
  sVar10 = local_98;
switchD_006481c4_caseD_3d:
  return sVar10;
switchD_00648264_caseD_13c:
  bVar6 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
  if (!bVar6) {
    ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar27 = "Expected Result Type to be bool scalar type";
LAB_006495a3:
    lVar25 = 0x2b;
    goto LAB_00649b43;
  }
  uVar12 = ValidationState_t::GetOperandTypeId(_,inst,2);
  bVar6 = ValidationState_t::IsIntScalarType(_,uVar12);
  if (bVar6) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag((DiagnosticStream *)local_268,_,SPV_ERROR_INVALID_DATA,inst);
  pcVar27 = "Expected Resident Code to be int scalar";
LAB_00648cae:
  lVar25 = 0x27;
  goto LAB_00649b43;
}

Assistant:

spv_result_t ImagePass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  if (IsImplicitLod(opcode)) {
    _.function(inst->function()->id())
        ->RegisterExecutionModelLimitation([opcode](spv::ExecutionModel model,
                                                    std::string* message) {
          if (model != spv::ExecutionModel::Fragment &&
              model != spv::ExecutionModel::GLCompute &&
              model != spv::ExecutionModel::MeshEXT &&
              model != spv::ExecutionModel::TaskEXT) {
            if (message) {
              *message =
                  std::string(
                      "ImplicitLod instructions require Fragment, GLCompute, "
                      "MeshEXT or TaskEXT execution model: ") +
                  spvOpcodeString(opcode);
            }
            return false;
          }
          return true;
        });
    _.function(inst->function()->id())
        ->RegisterLimitation([opcode](const ValidationState_t& state,
                                      const Function* entry_point,
                                      std::string* message) {
          const auto* models = state.GetExecutionModels(entry_point->id());
          const auto* modes = state.GetExecutionModes(entry_point->id());
          if (models &&
              (models->find(spv::ExecutionModel::GLCompute) != models->end() ||
               models->find(spv::ExecutionModel::MeshEXT) != models->end() ||
               models->find(spv::ExecutionModel::TaskEXT) != models->end()) &&
              (!modes ||
               (modes->find(spv::ExecutionMode::DerivativeGroupLinearKHR) ==
                    modes->end() &&
                modes->find(spv::ExecutionMode::DerivativeGroupQuadsKHR) ==
                    modes->end()))) {
            if (message) {
              *message = std::string(
                             "ImplicitLod instructions require "
                             "DerivativeGroupQuadsKHR "
                             "or DerivativeGroupLinearKHR execution mode for "
                             "GLCompute, "
                             "MeshEXT or TaskEXT execution model: ") +
                         spvOpcodeString(opcode);
            }
            return false;
          }
          return true;
        });
  }

  switch (opcode) {
    case spv::Op::OpTypeImage:
      return ValidateTypeImage(_, inst);
    case spv::Op::OpTypeSampledImage:
      return ValidateTypeSampledImage(_, inst);
    case spv::Op::OpSampledImage:
      return ValidateSampledImage(_, inst);
    case spv::Op::OpImageTexelPointer:
      return ValidateImageTexelPointer(_, inst);

    case spv::Op::OpImageSampleImplicitLod:
    case spv::Op::OpImageSampleExplicitLod:
    case spv::Op::OpImageSampleProjImplicitLod:
    case spv::Op::OpImageSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleImplicitLod:
    case spv::Op::OpImageSparseSampleExplicitLod:
      return ValidateImageLod(_, inst);

    case spv::Op::OpImageSampleDrefImplicitLod:
    case spv::Op::OpImageSampleDrefExplicitLod:
    case spv::Op::OpImageSampleProjDrefImplicitLod:
    case spv::Op::OpImageSampleProjDrefExplicitLod:
    case spv::Op::OpImageSparseSampleDrefImplicitLod:
    case spv::Op::OpImageSparseSampleDrefExplicitLod:
      return ValidateImageDrefLod(_, inst);

    case spv::Op::OpImageFetch:
    case spv::Op::OpImageSparseFetch:
      return ValidateImageFetch(_, inst);

    case spv::Op::OpImageGather:
    case spv::Op::OpImageDrefGather:
    case spv::Op::OpImageSparseGather:
    case spv::Op::OpImageSparseDrefGather:
      return ValidateImageGather(_, inst);

    case spv::Op::OpImageRead:
    case spv::Op::OpImageSparseRead:
      return ValidateImageRead(_, inst);

    case spv::Op::OpImageWrite:
      return ValidateImageWrite(_, inst);

    case spv::Op::OpImage:
      return ValidateImage(_, inst);

    case spv::Op::OpImageQueryFormat:
    case spv::Op::OpImageQueryOrder:
      return ValidateImageQueryFormatOrOrder(_, inst);

    case spv::Op::OpImageQuerySizeLod:
      return ValidateImageQuerySizeLod(_, inst);
    case spv::Op::OpImageQuerySize:
      return ValidateImageQuerySize(_, inst);
    case spv::Op::OpImageQueryLod:
      return ValidateImageQueryLod(_, inst);

    case spv::Op::OpImageQueryLevels:
    case spv::Op::OpImageQuerySamples:
      return ValidateImageQueryLevelsOrSamples(_, inst);

    case spv::Op::OpImageSparseSampleProjImplicitLod:
    case spv::Op::OpImageSparseSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefImplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefExplicitLod:
      return ValidateImageSparseLod(_, inst);

    case spv::Op::OpImageSparseTexelsResident:
      return ValidateImageSparseTexelsResident(_, inst);

    case spv::Op::OpImageSampleWeightedQCOM:
    case spv::Op::OpImageBoxFilterQCOM:
    case spv::Op::OpImageBlockMatchSSDQCOM:
    case spv::Op::OpImageBlockMatchSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSSDQCOM:
    case spv::Op::OpImageBlockMatchGatherSADQCOM:
    case spv::Op::OpImageBlockMatchGatherSSDQCOM:
      return ValidateImageProcessingQCOM(_, inst);

    default:
      break;
  }

  return SPV_SUCCESS;
}